

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::PickNegLogSoftmax,unsigned_int*&>
          (ComputationGraph *this,initializer_list<dynet::VariableIndex> *arguments,
          uint **side_information)

{
  size_type sVar1;
  initializer_list<dynet::VariableIndex> *in_RSI;
  PickNegLogSoftmax *in_RDI;
  VariableIndex *new_node_index;
  uint uVar2;
  initializer_list<dynet::VariableIndex> *a;
  PickNegLogSoftmax *this_00;
  uint local_24 [9];
  
  a = in_RSI;
  this_00 = in_RDI;
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size
                    ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)in_RSI);
  local_24[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)this_00,local_24);
  operator_new(0x88);
  PickNegLogSoftmax::PickNegLogSoftmax(this_00,a,(uint *)in_RSI);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back
            ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)in_RSI,(value_type *)in_RDI);
  uVar2 = (uint)in_RDI;
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)side_information);
  return (VariableIndex)uVar2;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
                                              Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}